

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscStatements.cpp
# Opt level: O0

void __thiscall
slang::ast::ImmediateAssertionStatement::serializeTo
          (ImmediateAssertionStatement *this,ASTSerializer *serializer)

{
  ASTSerializer *in_RSI;
  long in_RDI;
  string_view sVar1;
  char *in_stack_ffffffffffffff58;
  ASTSerializer *in_stack_ffffffffffffff60;
  undefined4 local_80;
  undefined8 local_78;
  undefined4 local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined4 local_50;
  undefined8 local_48;
  undefined4 local_40;
  undefined8 local_38;
  undefined4 local_30;
  undefined8 local_28;
  undefined4 local_20;
  undefined8 local_18;
  
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff60,
             in_stack_ffffffffffffff58);
  ASTSerializer::write(in_RSI,local_20,local_18,*(size_t *)(in_RDI + 0x20));
  if (*(long *)(in_RDI + 0x28) != 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff60,
               in_stack_ffffffffffffff58);
    ASTSerializer::write(in_RSI,local_30,local_28,*(size_t *)(in_RDI + 0x28));
  }
  if (*(long *)(in_RDI + 0x30) != 0) {
    in_stack_ffffffffffffff60 = in_RSI;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_RSI,in_stack_ffffffffffffff58)
    ;
    ASTSerializer::write(in_stack_ffffffffffffff60,local_40,local_38,*(size_t *)(in_RDI + 0x30));
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff60,
             in_stack_ffffffffffffff58);
  sVar1 = ast::toString(Assert);
  local_60 = sVar1._M_len;
  ASTSerializer::write(in_RSI,local_50,local_48,local_60);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff60,
             in_stack_ffffffffffffff58);
  ASTSerializer::write(in_RSI,local_70,local_68,(ulong)(*(byte *)(in_RDI + 0x3c) & 1));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff60,
             (char *)in_RSI);
  ASTSerializer::write(in_RSI,local_80,local_78,(ulong)(*(byte *)(in_RDI + 0x3d) & 1));
  return;
}

Assistant:

void ImmediateAssertionStatement::serializeTo(ASTSerializer& serializer) const {
    serializer.write("cond", cond);
    if (ifTrue)
        serializer.write("ifTrue", *ifTrue);
    if (ifFalse)
        serializer.write("ifFalse", *ifFalse);
    serializer.write("assertionKind", toString(assertionKind));
    serializer.write("isDeferred", isDeferred);
    serializer.write("isFinal", isFinal);
}